

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_avx2.c
# Opt level: O2

void quantize(__m256i *qp,__m256i *c,int16_t *iscan_ptr,int log_scale,tran_low_t *qcoeff,
             tran_low_t *dqcoeff,__m256i *eob)

{
  __m256i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  alVar1 = *c;
  auVar4 = vpabsd_avx2((undefined1  [32])alVar1);
  auVar5 = vpaddd_avx2(auVar4,(undefined1  [32])*qp);
  auVar6 = vpmuldq_avx2(auVar5,(undefined1  [32])qp[1]);
  auVar5 = vpsrlq_avx2(auVar5,0x20);
  auVar7 = vpsrlq_avx2((undefined1  [32])qp[1],0x20);
  auVar5 = vpmuldq_avx2(auVar5,auVar7);
  auVar6 = vpsrlq_avx2(auVar6,ZEXT416(0x10 - log_scale));
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x10 - log_scale));
  auVar5 = vpsllq_avx2(auVar5,0x20);
  auVar5 = vpor_avx2(auVar5,auVar6);
  auVar4 = vpslld_avx2(auVar4,ZEXT416(log_scale + 1));
  auVar4 = vpcmpgtd_avx2((undefined1  [32])qp[2],auVar4);
  auVar4 = vpandn_avx2(auVar4,auVar5);
  auVar5 = vpmulld_avx2(auVar4,(undefined1  [32])qp[2]);
  auVar5 = vpsrad_avx2(auVar5,ZEXT416((uint)log_scale));
  auVar4 = vpsignd_avx2(auVar4,(undefined1  [32])alVar1);
  auVar5 = vpsignd_avx2(auVar5,(undefined1  [32])alVar1);
  *(undefined1 (*) [32])qcoeff = auVar4;
  *(undefined1 (*) [32])dqcoeff = auVar5;
  auVar2 = vpmovzxwd_avx(*(undefined1 (*) [16])iscan_ptr);
  auVar3 = vpunpckhwd_avx(*(undefined1 (*) [16])iscan_ptr,(undefined1  [16])0x0);
  auVar4._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar4._16_16_ = ZEXT116(1) * auVar3;
  auVar6 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar5 = vpcmpeqd_avx2(auVar5,auVar6);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  auVar6 = vpcmpeqd_avx2(auVar6,auVar6);
  auVar4 = vpsubd_avx2(auVar4,auVar6);
  auVar4 = vpandn_avx2(auVar5,auVar4);
  alVar1 = (__m256i)vpmaxsd_avx2(auVar4,(undefined1  [32])*eob);
  *eob = alVar1;
  return;
}

Assistant:

static inline void quantize(const __m256i *qp, __m256i *c,
                            const int16_t *iscan_ptr, int log_scale,
                            tran_low_t *qcoeff, tran_low_t *dqcoeff,
                            __m256i *eob) {
  const __m256i abs_coeff = _mm256_abs_epi32(*c);
  __m256i q = _mm256_add_epi32(abs_coeff, qp[0]);

  __m256i q_lo = _mm256_mul_epi32(q, qp[1]);
  __m256i q_hi = _mm256_srli_epi64(q, 32);
  const __m256i qp_hi = _mm256_srli_epi64(qp[1], 32);
  q_hi = _mm256_mul_epi32(q_hi, qp_hi);
  q_lo = _mm256_srli_epi64(q_lo, 16 - log_scale);
  q_hi = _mm256_srli_epi64(q_hi, 16 - log_scale);
  q_hi = _mm256_slli_epi64(q_hi, 32);
  q = _mm256_or_si256(q_lo, q_hi);
  const __m256i abs_s = _mm256_slli_epi32(abs_coeff, 1 + log_scale);
  const __m256i mask = _mm256_cmpgt_epi32(qp[2], abs_s);
  q = _mm256_andnot_si256(mask, q);

  __m256i dq = _mm256_mullo_epi32(q, qp[2]);
  dq = _mm256_srai_epi32(dq, log_scale);
  q = _mm256_sign_epi32(q, *c);
  dq = _mm256_sign_epi32(dq, *c);

  _mm256_storeu_si256((__m256i *)qcoeff, q);
  _mm256_storeu_si256((__m256i *)dqcoeff, dq);

  const __m128i isc = _mm_loadu_si128((const __m128i *)iscan_ptr);
  const __m128i zr = _mm_setzero_si128();
  const __m128i lo = _mm_unpacklo_epi16(isc, zr);
  const __m128i hi = _mm_unpackhi_epi16(isc, zr);
  const __m256i iscan =
      _mm256_insertf128_si256(_mm256_castsi128_si256(lo), hi, 1);

  const __m256i zero = _mm256_setzero_si256();
  const __m256i zc = _mm256_cmpeq_epi32(dq, zero);
  const __m256i nz = _mm256_cmpeq_epi32(zc, zero);
  __m256i cur_eob = _mm256_sub_epi32(iscan, nz);
  cur_eob = _mm256_and_si256(cur_eob, nz);
  *eob = _mm256_max_epi32(cur_eob, *eob);
}